

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void temp_free_or_dead(TCGContext_conflict9 *s,TCGTemp *ts,int free_or_dead)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *(ulong *)ts;
  if ((uVar1 >> 0x20 & 1) == 0) {
    if (((uint)uVar1 & 0xff00) == 0x100) {
      s->reg_to_temp[uVar1 & 0xff] = (TCGTemp *)0x0;
      uVar1 = *(ulong *)ts;
    }
    uVar2 = uVar1 >> 0x1c & 0x200;
    if ((uVar1 >> 0x26 & 1) != 0) {
      uVar2 = 0x200;
    }
    if (free_or_dead < 0) {
      uVar2 = 0x200;
    }
    *(ulong *)ts = uVar1 & 0xffffffffffff00ff | uVar2;
  }
  return;
}

Assistant:

static void temp_free_or_dead(TCGContext *s, TCGTemp *ts, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (ts->val_type == TEMP_VAL_REG) {
        s->reg_to_temp[ts->reg] = NULL;
    }
    ts->val_type = (free_or_dead < 0
                    || ts->temp_local
                    || ts->temp_global
                    ? TEMP_VAL_MEM : TEMP_VAL_DEAD);
}